

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int fits_parser_set_temporary_col
              (ParseData *lParse,parseInfo *Info,long nrows,void *nulval,int *status)

{
  int nCol;
  int iVar1;
  
  iVar1 = *status;
  if (iVar1 == 0) {
    nCol = lParse->nCols;
    iVar1 = fits_parser_allocateCol(lParse,nCol,status);
    if (iVar1 == 0) {
      iVar1 = 0;
      fits_iter_set_by_num(lParse->colData + nCol,(fitsfile *)0x0,0,0x52,3);
      lParse->colData[nCol].repeat = lParse->nElements;
      Info->dataPtr = (void *)0x0;
      Info->nullPtr = nulval;
      Info->maxRows = nrows;
      Info->parseData = lParse;
      lParse->nCols = lParse->nCols + 1;
    }
    else {
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int fits_parser_set_temporary_col(ParseData *lParse,
				  parseInfo *Info,
				  long int nrows,
				  void *nulval,
				  int *status)
{
  int col_cnt;
  /* Setup iterator column and parser information to be ready to compute 
     temporary calculator expression */

  if (*status) return *status;

  col_cnt = lParse->nCols;

  if( fits_parser_allocateCol( lParse, col_cnt, status ) ) return *status;
	
  /* Set important variables for TemporaryCol where calculated results end up */
  fits_iter_set_by_num( &(lParse->colData[col_cnt]), 0, 0, TDOUBLE, TemporaryCol);
  lParse->colData[col_cnt].repeat = lParse->nElements;
  Info->dataPtr = NULL;
  Info->nullPtr = nulval;
  Info->maxRows = nrows;
  Info->parseData = lParse;
  lParse->nCols ++;

  return 0;
}